

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MockCallTest_ignoreOtherCallsDoesntIgnoreMultipleCallsOfTheSameFunction_TestShell::createTest
          (TEST_MockCallTest_ignoreOtherCallsDoesntIgnoreMultipleCallsOfTheSameFunction_TestShell
           *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
                                  ,0x136);
  TEST_MockCallTest_ignoreOtherCallsDoesntIgnoreMultipleCallsOfTheSameFunction_Test::
  TEST_MockCallTest_ignoreOtherCallsDoesntIgnoreMultipleCallsOfTheSameFunction_Test
            ((TEST_MockCallTest_ignoreOtherCallsDoesntIgnoreMultipleCallsOfTheSameFunction_Test *)
             this_00);
  return this_00;
}

Assistant:

TEST(MockCallTest, ignoreOtherCallsDoesntIgnoreMultipleCallsOfTheSameFunction)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->callWasMade(1);
    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "foo", expectations);

    mock().expectOneCall("foo");
    mock().ignoreOtherCalls();
    mock().actualCall("bar");
    mock().actualCall("foo");
    mock().actualCall("foo");

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}